

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

unsigned_long * __thiscall
google::protobuf::RepeatedField<unsigned_long>::elements
          (RepeatedField<unsigned_long> *this,bool is_soo)

{
  int iVar1;
  unsigned_long *puVar2;
  Nonnull<const_char_*> pcVar3;
  undefined7 in_register_00000031;
  
  iVar1 = 1;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar1 < 1) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar1,0,"Capacity(is_soo) > 0");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if (is_soo) {
      return (unsigned_long *)((long)&(this->soo_rep_).field_0 + 8);
    }
    puVar2 = (unsigned_long *)internal::LongSooRep::elements((LongSooRep *)this);
    return puVar2;
  }
  elements();
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }